

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::on_text(format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          *this,wchar_t *begin,wchar_t *end)

{
  type __n;
  iterator it_00;
  wchar_t *pwVar1;
  wchar_t *in_RDX;
  long in_RDI;
  type *it;
  iterator out;
  type size;
  size_t in_stack_ffffffffffffffc8;
  back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> *in_stack_ffffffffffffffd0;
  undefined8 *puVar2;
  
  __n = internal::to_unsigned<long>((long)in_stack_ffffffffffffffd0);
  it_00 = internal::
          context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
          ::out((context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
                 *)(in_RDI + 8));
  internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  puVar2 = (undefined8 *)&stack0xffffffffffffffc8;
  pwVar1 = std::copy_n<wchar_t_const*,unsigned_long,wchar_t*>(in_RDX,__n,(wchar_t *)it_00.container)
  ;
  *puVar2 = pwVar1;
  internal::
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
  ::advance_to((context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
                *)(in_RDI + 8),it_00);
  return;
}

Assistant:

void on_text(const Char *begin, const Char *end) {
    auto size = internal::to_unsigned(end - begin);
    auto out = context.out();
    auto &&it = internal::reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }